

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDiameterDimension::IfcDiameterDimension(IfcDiameterDimension *this)

{
  IfcDiameterDimension *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcDimensionCurveDirectedCallout).field_0x68,
             "IfcDiameterDimension");
  IfcDimensionCurveDirectedCallout::IfcDimensionCurveDirectedCallout
            (&this->super_IfcDimensionCurveDirectedCallout,&PTR_construction_vtable_24__00e7e220);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDiameterDimension,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDiameterDimension,_0UL> *)
             &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x58,
             &PTR_construction_vtable_24__00e7e2d0);
  (this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xe7e140;
  *(undefined8 *)&(this->super_IfcDimensionCurveDirectedCallout).field_0x68 = 0xe7e208;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xe7e168;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xe7e190;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x48 = 0xe7e1b8;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x58 = 0xe7e1e0;
  return;
}

Assistant:

IfcDiameterDimension() : Object("IfcDiameterDimension") {}